

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O3

void av1_dist_wtd_convolve_x_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  long lVar4;
  long lVar5;
  CONV_BUF_TYPE *pCVar6;
  char cVar7;
  int iVar8;
  uint8_t *puVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint8_t *puVar13;
  uint uVar14;
  uint uVar15;
  uint8_t *puVar16;
  CONV_BUF_TYPE *pCVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined2 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  
  pCVar6 = conv_params->dst;
  uVar23 = (undefined2)conv_params->fwd_offset;
  auVar19._2_2_ = uVar23;
  auVar19._0_2_ = uVar23;
  auVar19._4_2_ = uVar23;
  auVar19._6_2_ = uVar23;
  auVar19._8_2_ = uVar23;
  auVar19._10_2_ = uVar23;
  auVar19._12_2_ = uVar23;
  auVar19._14_2_ = uVar23;
  auVar19._16_2_ = uVar23;
  auVar19._18_2_ = uVar23;
  auVar19._20_2_ = uVar23;
  auVar19._22_2_ = uVar23;
  auVar19._24_2_ = uVar23;
  auVar19._26_2_ = uVar23;
  auVar19._28_2_ = uVar23;
  auVar19._30_2_ = uVar23;
  uVar15 = 7 - conv_params->round_1;
  iVar8 = conv_params->round_1 + conv_params->round_0;
  cVar7 = (char)iVar8;
  auVar25._16_16_ =
       *(undefined1 (*) [16])
        (filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps);
  auVar25._0_16_ =
       *(undefined1 (*) [16])
        (filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps);
  lVar18 = (long)conv_params->dst_stride;
  uVar23 = (undefined2)conv_params->bck_offset;
  auVar21._2_2_ = uVar23;
  auVar21._0_2_ = uVar23;
  auVar21._4_2_ = uVar23;
  auVar21._6_2_ = uVar23;
  auVar21._8_2_ = uVar23;
  auVar21._10_2_ = uVar23;
  auVar21._12_2_ = uVar23;
  auVar21._14_2_ = uVar23;
  auVar21._16_2_ = uVar23;
  auVar21._18_2_ = uVar23;
  auVar21._20_2_ = uVar23;
  auVar21._22_2_ = uVar23;
  auVar21._24_2_ = uVar23;
  auVar21._26_2_ = uVar23;
  auVar21._28_2_ = uVar23;
  auVar21._30_2_ = uVar23;
  auVar3 = vpunpcklwd_avx2(auVar19,auVar21);
  uVar14 = 0xe - iVar8;
  uVar12 = conv_params->round_0 - 1;
  iVar8 = conv_params->do_average;
  iVar1 = conv_params->use_dist_wtd_comp_avg;
  auVar22._0_2_ = (undefined2)((1 << (0x15U - cVar7 & 0x1f)) + (1 << (0x16U - cVar7 & 0x1f)));
  auVar22._2_2_ = auVar22._0_2_;
  auVar22._4_2_ = auVar22._0_2_;
  auVar22._6_2_ = auVar22._0_2_;
  auVar22._8_2_ = auVar22._0_2_;
  auVar22._10_2_ = auVar22._0_2_;
  auVar22._12_2_ = auVar22._0_2_;
  auVar22._14_2_ = auVar22._0_2_;
  auVar22._16_2_ = auVar22._0_2_;
  auVar22._18_2_ = auVar22._0_2_;
  auVar22._20_2_ = auVar22._0_2_;
  auVar22._22_2_ = auVar22._0_2_;
  auVar22._24_2_ = auVar22._0_2_;
  auVar22._26_2_ = auVar22._0_2_;
  auVar22._28_2_ = auVar22._0_2_;
  auVar22._30_2_ = auVar22._0_2_;
  uVar23 = (undefined2)((uint)(1 << ((byte)uVar14 & 0x1f)) >> 1);
  auVar30._2_2_ = uVar23;
  auVar30._0_2_ = uVar23;
  auVar30._4_2_ = uVar23;
  auVar30._6_2_ = uVar23;
  auVar30._8_2_ = uVar23;
  auVar30._10_2_ = uVar23;
  auVar30._12_2_ = uVar23;
  auVar30._14_2_ = uVar23;
  auVar30._16_2_ = uVar23;
  auVar30._18_2_ = uVar23;
  auVar30._20_2_ = uVar23;
  auVar30._22_2_ = uVar23;
  auVar30._24_2_ = uVar23;
  auVar30._26_2_ = uVar23;
  auVar30._28_2_ = uVar23;
  auVar30._30_2_ = uVar23;
  uVar23 = (undefined2)((uint)(1 << ((byte)uVar12 & 0x1f)) >> 1);
  auVar24._2_2_ = uVar23;
  auVar24._0_2_ = uVar23;
  auVar24._4_2_ = uVar23;
  auVar24._6_2_ = uVar23;
  auVar24._8_2_ = uVar23;
  auVar24._10_2_ = uVar23;
  auVar24._12_2_ = uVar23;
  auVar24._14_2_ = uVar23;
  auVar24._16_2_ = uVar23;
  auVar24._18_2_ = uVar23;
  auVar24._20_2_ = uVar23;
  auVar24._22_2_ = uVar23;
  auVar24._24_2_ = uVar23;
  auVar24._26_2_ = uVar23;
  auVar24._28_2_ = uVar23;
  auVar24._30_2_ = uVar23;
  auVar26 = vpsraw_avx2(auVar25,1);
  auVar19 = vpshufb_avx2(auVar26,_DAT_00561f20);
  auVar21 = vpshufb_avx2(auVar26,_DAT_00561e60);
  auVar25 = vpshufb_avx2(auVar26,_DAT_00561e80);
  auVar26 = vpshufb_avx2(auVar26,_DAT_00561ea0);
  auVar2 = vpor_avx(auVar19._0_16_,auVar26._0_16_);
  if (auVar2._0_4_ == 0) {
    if (0 < h) {
      auVar19 = vpsubw_avx2(auVar30,auVar22);
      puVar16 = dst0 + dst_stride0;
      pCVar17 = pCVar6 + lVar18;
      puVar13 = src + (long)src_stride + -1;
      puVar9 = src + -1;
      lVar4 = (long)src_stride * 2;
      lVar5 = (long)dst_stride0 * 2;
      uVar11 = 0;
      auVar26._16_16_ = _DAT_0050db40;
      auVar26._0_16_ = _DAT_0050db40;
      auVar20._16_16_ = _DAT_0050d720;
      auVar20._0_16_ = _DAT_0050d720;
      do {
        if (0 < w) {
          lVar10 = 0;
          do {
            auVar29._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(puVar13 + lVar10) +
                 ZEXT116(1) * *(undefined1 (*) [16])(puVar9 + lVar10);
            auVar29._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(puVar13 + lVar10);
            auVar30 = vpshufb_avx2(auVar29,auVar26);
            auVar29 = vpshufb_avx2(auVar29,auVar20);
            auVar30 = vpmaddubsw_avx2(auVar30,auVar21);
            auVar29 = vpmaddubsw_avx2(auVar29,auVar25);
            auVar30 = vpaddw_avx2(auVar30,auVar24);
            auVar30 = vpaddw_avx2(auVar30,auVar29);
            auVar30 = vpsraw_avx2(auVar30,ZEXT416(uVar12));
            auVar30 = vpsllw_avx2(auVar30,ZEXT416(uVar15));
            auVar30 = vpaddw_avx2(auVar30,auVar22);
            if (iVar8 == 0) {
              *(undefined1 (*) [16])(pCVar6 + lVar10) = auVar30._0_16_;
              *(undefined1 (*) [16])(pCVar17 + lVar10) = auVar30._16_16_;
            }
            else {
              auVar31._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(pCVar17 + lVar10) +
                   ZEXT116(1) * *(undefined1 (*) [16])(pCVar6 + lVar10);
              auVar31._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])(pCVar17 + lVar10);
              if (iVar1 == 0) {
                auVar30 = vpaddw_avx2(auVar30,auVar31);
                auVar30 = vpsraw_avx2(auVar30,1);
              }
              else {
                auVar32 = vpunpcklwd_avx2(auVar31,auVar30);
                auVar29 = vpunpckhwd_avx2(auVar31,auVar30);
                auVar30 = vpmaddwd_avx2(auVar32,auVar3);
                auVar29 = vpmaddwd_avx2(auVar29,auVar3);
                auVar31 = vpsrad_avx2(auVar30,4);
                auVar30 = vpsrad_avx2(auVar29,4);
                auVar30 = vpackssdw_avx2(auVar31,auVar30);
              }
              auVar30 = vpaddw_avx2(auVar30,auVar19);
              auVar30 = vpsraw_avx2(auVar30,ZEXT416(uVar14));
              auVar30 = vpackuswb_avx2(auVar30,auVar3);
              if (w < 5) {
                *(int *)(dst0 + lVar10) = auVar30._0_4_;
                *(int *)(puVar16 + lVar10) = auVar30._16_4_;
              }
              else {
                *(long *)(dst0 + lVar10) = auVar30._0_8_;
                *(long *)(puVar16 + lVar10) = auVar30._16_8_;
              }
            }
            lVar10 = lVar10 + 8;
          } while (lVar10 < w);
        }
        uVar11 = uVar11 + 2;
        pCVar17 = pCVar17 + lVar18 * 2;
        puVar13 = puVar13 + lVar4;
        pCVar6 = pCVar6 + lVar18 * 2;
        puVar16 = puVar16 + lVar5;
        dst0 = dst0 + lVar5;
        puVar9 = puVar9 + lVar4;
      } while (uVar11 < (uint)h);
    }
  }
  else if (0 < h) {
    uVar11 = (ulong)(filter_params_x->taps >> 1);
    puVar13 = src + (1 - uVar11);
    auVar30 = vpsubw_avx2(auVar30,auVar22);
    puVar9 = src + ((long)src_stride - uVar11) + 1;
    puVar16 = dst0 + dst_stride0;
    pCVar17 = pCVar6 + lVar18;
    lVar4 = (long)src_stride * 2;
    lVar5 = (long)dst_stride0 * 2;
    uVar11 = 0;
    auVar32._16_16_ = _DAT_0050d730;
    auVar32._0_16_ = _DAT_0050d730;
    auVar33._16_16_ = _DAT_0050e570;
    auVar33._0_16_ = _DAT_0050e570;
    do {
      if (0 < w) {
        lVar10 = 0;
        do {
          auVar27._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(puVar9 + lVar10) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar13 + lVar10);
          auVar27._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(puVar9 + lVar10);
          auVar20 = vpshufb_avx2(auVar27,_DAT_0050e4e0);
          auVar31 = vpshufb_avx2(auVar27,_DAT_0050e480);
          auVar28 = vpshufb_avx2(auVar27,auVar32);
          auVar27 = vpshufb_avx2(auVar27,auVar33);
          auVar29 = vpmaddubsw_avx2(auVar20,auVar19);
          auVar20 = vpmaddubsw_avx2(auVar31,auVar21);
          auVar31 = vpmaddubsw_avx2(auVar28,auVar25);
          auVar20 = vpaddw_avx2(auVar20,auVar31);
          auVar31 = vpmaddubsw_avx2(auVar27,auVar26);
          auVar29 = vpaddw_avx2(auVar29,auVar24);
          auVar20 = vpaddw_avx2(auVar29,auVar20);
          auVar20 = vpaddw_avx2(auVar31,auVar20);
          auVar20 = vpsraw_avx2(auVar20,ZEXT416(uVar12));
          auVar20 = vpsllw_avx2(auVar20,ZEXT416(uVar15));
          auVar20 = vpaddw_avx2(auVar20,auVar22);
          if (iVar8 == 0) {
            *(undefined1 (*) [16])(pCVar6 + lVar10) = auVar20._0_16_;
            *(undefined1 (*) [16])(pCVar17 + lVar10) = auVar20._16_16_;
          }
          else {
            auVar28._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(pCVar17 + lVar10) +
                 ZEXT116(1) * *(undefined1 (*) [16])(pCVar6 + lVar10);
            auVar28._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(pCVar17 + lVar10);
            if (iVar1 == 0) {
              auVar20 = vpaddw_avx2(auVar20,auVar28);
              auVar20 = vpsraw_avx2(auVar20,1);
            }
            else {
              auVar31 = vpunpcklwd_avx2(auVar28,auVar20);
              auVar29 = vpunpckhwd_avx2(auVar28,auVar20);
              auVar20 = vpmaddwd_avx2(auVar3,auVar31);
              auVar29 = vpmaddwd_avx2(auVar29,auVar3);
              auVar20 = vpsrad_avx2(auVar20,4);
              auVar29 = vpsrad_avx2(auVar29,4);
              auVar20 = vpackssdw_avx2(auVar20,auVar29);
            }
            auVar20 = vpaddw_avx2(auVar30,auVar20);
            auVar20 = vpsraw_avx2(auVar20,ZEXT416(uVar14));
            auVar20 = vpackuswb_avx2(auVar20,auVar20);
            if (w < 5) {
              *(int *)(dst0 + lVar10) = auVar20._0_4_;
              *(int *)(puVar16 + lVar10) = auVar20._16_4_;
            }
            else {
              *(long *)(dst0 + lVar10) = auVar20._0_8_;
              *(long *)(puVar16 + lVar10) = auVar20._16_8_;
            }
          }
          lVar10 = lVar10 + 8;
        } while (lVar10 < w);
      }
      uVar11 = uVar11 + 2;
      pCVar17 = pCVar17 + lVar18 * 2;
      puVar9 = puVar9 + lVar4;
      pCVar6 = pCVar6 + lVar18 * 2;
      puVar16 = puVar16 + lVar5;
      dst0 = dst0 + lVar5;
      puVar13 = puVar13 + lVar4;
    } while (uVar11 < (uint)h);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_x_avx2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const int subpel_x_qn,
                                  ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;
  int i, j, is_horiz_4tap = 0;
  const int bits = FILTER_BITS - conv_params->round_1;
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);

  assert(bits >= 0);
  assert(conv_params->round_0 > 0);

  const __m256i round_const =
      _mm256_set1_epi16((1 << (conv_params->round_0 - 1)) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0 - 1);

  __m256i filt[4], coeffs[4];

  filt[0] = _mm256_load_si256((__m256i const *)filt_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));

  prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs);

  // Condition for checking valid horz_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs[0], coeffs[3]), 0)))
    is_horiz_4tap = 1;

  // horz_filt as 4 tap
  if (is_horiz_4tap) {
    const int fo_horiz = 1;
    const uint8_t *const src_ptr = src - fo_horiz;
    for (i = 0; i < h; i += 2) {
      const uint8_t *src_data = src_ptr + i * src_stride;
      CONV_BUF_TYPE *dst_data = dst + i * dst_stride;
      for (j = 0; j < w; j += 8) {
        const __m256i data =
            load_line2_avx2(&src_data[j], &src_data[j + src_stride]);

        __m256i res = convolve_lowbd_x_4tap(data, coeffs + 1, filt);
        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const), round_shift);
        res = _mm256_slli_epi16(res, bits);

        const __m256i res_unsigned = _mm256_add_epi16(res, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m256i data_ref_0 =
              load_line2_avx2(&dst_data[j], &dst_data[j + dst_stride]);
          const __m256i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m256i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_8 = _mm256_packus_epi16(round_result, round_result);
          const __m128i res_0 = _mm256_castsi256_si128(res_8);
          const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

          if (w > 4) {
            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);
          }
        } else {
          const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

          const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  } else {
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));
    for (i = 0; i < h; i += 2) {
      const uint8_t *src_data = src_ptr + i * src_stride;
      CONV_BUF_TYPE *dst_data = dst + i * dst_stride;
      for (j = 0; j < w; j += 8) {
        const __m256i data =
            load_line2_avx2(&src_data[j], &src_data[j + src_stride]);

        __m256i res = convolve_lowbd_x(data, coeffs, filt);

        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const), round_shift);

        res = _mm256_slli_epi16(res, bits);

        const __m256i res_unsigned = _mm256_add_epi16(res, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m256i data_ref_0 =
              load_line2_avx2(&dst_data[j], &dst_data[j + dst_stride]);
          const __m256i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m256i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_8 = _mm256_packus_epi16(round_result, round_result);
          const __m128i res_0 = _mm256_castsi256_si128(res_8);
          const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

          if (w > 4) {
            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);
          }
        } else {
          const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

          const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  }
}